

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t exr_attr_set_v2i(exr_context_t ctxt,int part_index,char *name,exr_attr_v2i_t *val)

{
  exr_result_t eVar1;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_30;
  
  local_30 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar1 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar1;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar3 = 0x15;
LAB_0011b52a:
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar3);
    return eVar1;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar3 = 8;
    goto LAB_0011b52a;
  }
  list = (exr_attribute_list_t *)
         (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
  eVar1 = exr_attr_list_find_by_name(ctxt,list,name,&local_30);
  if (eVar1 == 0) {
    if (local_30->type != EXR_ATTR_V2I) {
      pcVar4 = local_30->type_name;
      pcVar2 = "\'%s\' requested type \'v2i\', but stored attributes is type \'%s\'";
      uVar3 = 0x10;
      goto LAB_0011b5f0;
    }
    if (val != (exr_attr_v2i_t *)0x0) goto LAB_0011b5b4;
  }
  else {
    if (eVar1 != 0xf) {
      return eVar1;
    }
    if (*ctxt != (_priv_exr_context_t)0x1) {
      return 0xf;
    }
    eVar1 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_V2I,0,(uint8_t **)0x0,&local_30);
    if (val != (exr_attr_v2i_t *)0x0) {
      if (eVar1 != 0) {
        return eVar1;
      }
LAB_0011b5b4:
      ((anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)(local_30->field_6).box2i)->field_0 =
           (anon_struct_8_2_947311e6_for_anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0_0)val->field_0
      ;
      return 0;
    }
  }
  pcVar2 = "No input value for setting \'%s\', type \'%s\'";
  pcVar4 = "v2i";
  uVar3 = 3;
LAB_0011b5f0:
  eVar1 = (**(code **)(ctxt + 0x48))(ctxt,uVar3,pcVar2,name,pcVar4);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_v2i (
    exr_context_t         ctxt,
    int                   part_index,
    const char*           name,
    const exr_attr_v2i_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_V2I, v2i);
}